

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

boolean emergency_disrobe(boolean *lostsome)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  obj *poVar5;
  obj *poVar6;
  obj *obj;
  
  uVar1 = inv_cnt();
  do {
    iVar2 = near_capacity();
    if (iVar2 <= (int)(uint)(uball == (obj *)0x0)) {
      return '\x01';
    }
    if ((int)uVar1 < 1) {
LAB_0026b1bc:
      poVar6 = (obj *)0x0;
    }
    else {
      uVar3 = mt_random();
      if (invent == (obj *)0x0) goto LAB_0026b1bc;
      uVar4 = (ulong)uVar3 % (ulong)uVar1;
      poVar5 = (obj *)0x0;
      obj = invent;
      do {
        poVar6 = poVar5;
        if (((((((obj->otyp != 0x210) || ((obj->field_0x4a & 1) == 0)) && (obj != uamul)) &&
              ((obj != uleft && (obj != uright)))) &&
             ((obj != ublindf && ((obj != uarm && (obj != uarmc)))))) && (obj != uarmg)) &&
           ((((obj != uarmf && (obj != uarmu)) &&
             (((obj->field_0x4a & 1) == 0 || ((obj != uarmh && (obj != uarms)))))) &&
            (iVar2 = welded(obj), poVar6 = obj, iVar2 != 0)))) {
          poVar6 = poVar5;
        }
        if (((int)uVar4 < 1) && (poVar6 != (obj *)0x0)) break;
        uVar4 = (ulong)((int)uVar4 - 1);
        obj = obj->nobj;
        poVar5 = poVar6;
      } while (obj != (obj *)0x0);
    }
    if (poVar6 != (obj *)0x0) {
      if (poVar6->owornmask != 0) {
        remove_worn_item(poVar6,'\0');
      }
      *lostsome = '\x01';
      dropx(poVar6);
      uVar1 = uVar1 - 1;
    }
    if (poVar6 == (obj *)0x0) {
      return '\0';
    }
  } while( true );
}

Assistant:

static boolean emergency_disrobe(boolean *lostsome)
{
	int invc = inv_cnt();

	while (near_capacity() > (Punished ? UNENCUMBERED : SLT_ENCUMBER)) {
	    struct obj *obj, *otmp = NULL;
	    int i;

	    /* Pick a random object */
	    if (invc > 0) {
		i = rn2(invc);
		for (obj = invent; obj; obj = obj->nobj) {
		    /*
		     * Undroppables are: body armor, boots, gloves,
		     * amulets, and rings because of the time and effort
		     * in removing them + loadstone and other cursed stuff
		     * for obvious reasons.
		     */
		    if (!((obj->otyp == LOADSTONE && obj->cursed) ||
			  obj == uamul || obj == uleft || obj == uright ||
			  obj == ublindf || obj == uarm || obj == uarmc ||
			  obj == uarmg || obj == uarmf || obj == uarmu ||
			  (obj->cursed && (obj == uarmh || obj == uarms)) ||
			  welded(obj)))
			otmp = obj;
		    /* reached the mark and found some stuff to drop? */
		    if (--i < 0 && otmp) break;

		    /* else continue */
		}
	    }
	    if (!otmp)
		return FALSE; /* nothing to drop! */

	    if (otmp->owornmask) remove_worn_item(otmp, FALSE);
	    *lostsome = TRUE;
	    dropx(otmp);
	    invc--;
	}
	return TRUE;
}